

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O1

KString * __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Electromagnetic_Emission_PDU *this)

{
  pointer pEVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  pointer pEVar3;
  KStringStream ss;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_278,&this->super_Header);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_278._M_dataplus._M_p,local_278._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-Electromagnetic Emission PDU-\n",0x1f)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Emitting Entity ID:\n",0x14);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_EmittingEntityID);
  UTILS::IndentString(&local_218,&local_1d8,Tabs,in_CL);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Event ID:\n",10);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f8,&this->m_EventID);
  UTILS::IndentString(&local_238,&local_1f8,Tabs_00,in_CL);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"State Update Indicator:     ",0x1c);
  DATA_TYPE::ENUMS::GetEnumAsStringStateUpdateIndicator_abi_cxx11_
            (&local_258,(ENUMS *)(ulong)this->m_ui8StateUpdateIndicator,Value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Number Of Emission Systems: ",0x1c);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  pEVar1 = (this->m_vEmissionSystem).
           super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar3 = (this->m_vEmissionSystem).
                super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar1; pEVar3 = pEVar3 + 1) {
    (*(pEVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_278,pEVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_278._M_dataplus._M_p,local_278._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString Electromagnetic_Emission_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Electromagnetic Emission PDU-\n"
       << "Emitting Entity ID:\n"
       << IndentString( m_EmittingEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "State Update Indicator:     " << GetEnumAsStringStateUpdateIndicator( m_ui8StateUpdateIndicator ) << "\n"
       << "Number Of Emission Systems: " << ( KUINT16 )m_ui8NumberOfEmissionSystems  << "\n";

    vector<EmissionSystem>::const_iterator citr = m_vEmissionSystem.begin();
    vector<EmissionSystem>::const_iterator citrEnd = m_vEmissionSystem.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}